

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O2

void __thiscall Lodtalk::GarbageCollector::~GarbageCollector(GarbageCollector *this)

{
  std::_Vector_base<Lodtalk::StackMemory_*,_std::allocator<Lodtalk::StackMemory_*>_>::~_Vector_base
            (&(this->currentStacks).
              super__Vector_base<Lodtalk::StackMemory_*,_std::allocator<Lodtalk::StackMemory_*>_>);
  std::_Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::~_Vector_base
            (&(this->nativeObjects).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>)
  ;
  std::
  _Vector_base<std::pair<Lodtalk::Oop_*,_unsigned_long>,_std::allocator<std::pair<Lodtalk::Oop_*,_unsigned_long>_>_>
  ::~_Vector_base(&(this->rootPointers).
                   super__Vector_base<std::pair<Lodtalk::Oop_*,_unsigned_long>,_std::allocator<std::pair<Lodtalk::Oop_*,_unsigned_long>_>_>
                 );
  return;
}

Assistant:

GarbageCollector::~GarbageCollector()
{
}